

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O2

void __thiscall
xcardMT::runnerLS(xcardMT *this,longlong start,longlong end,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *result)

{
  bool bVar1;
  ostream *poVar2;
  string card;
  string local_70;
  string local_50;
  
  for (; start < end; start = start + 1) {
    std::__cxx11::to_string(&local_50,start);
    bVar1 = xcard::LuhnCheck(&this->super_xcard,&local_50);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(result,&local_50);
      if ((this->super_xcard).debug != 0) {
        std::mutex::lock(&mutex);
        poVar2 = std::operator<<((ostream *)&std::cout,"[VALID] ");
        poVar2 = std::operator<<(poVar2,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar2);
        pthread_mutex_unlock((pthread_mutex_t *)&mutex);
      }
    }
    else {
      std::__cxx11::to_string(&local_70,0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void xcardMT::runnerLS(long long int start, long long int end, std::vector<std::string> *result)
{

    int countdown = 10;

    for (long long int i = start; i < end; i++)
    {

        std::string card = std::to_string(i);

        if (LuhnCheck(card) == true)
        {
            result->push_back(card);
            if (this->debug){
                mutex.lock();
                std::cout << "[VALID] " << card << std::endl;
                mutex.unlock();
            }
        }
        else{
            result->push_back(std::to_string(false));
        }

        countdown--;

        if (countdown == 0)
        {
            //reset
            countdown = 10;
        }
    }
}